

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  float *pfVar3;
  StackItemT<embree::NodeRefPtr<4>_> SVar4;
  AccelData *pAVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [12];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined4 in_EAX;
  uint uVar17;
  undefined4 uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  Geometry *pGVar23;
  ulong uVar24;
  _func_int **pp_Var25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  ulong uVar27;
  Geometry *pGVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  NodeRef nodeRef;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar36 [12];
  float fVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  float fVar62;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar73;
  undefined1 auVar72 [16];
  float fVar80;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [12];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [12];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [12];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar119;
  float fVar127;
  undefined1 auVar120 [12];
  float fVar126;
  float fVar128;
  float fVar129;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  vint<4> octant;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  RTCIntersectFunctionNArguments local_1198;
  Geometry *local_1168;
  undefined8 local_1160;
  RTCIntersectArguments *local_1158;
  undefined1 local_1148 [16];
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  vfloat<4> fmin;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar67 [16];
  undefined1 auVar108 [16];
  
  auVar82._8_4_ = 0xffffffff;
  auVar82._0_8_ = 0xffffffffffffffff;
  auVar82._12_4_ = 0xffffffff;
  auVar37._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar37._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar37._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar37._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar17 = movmskps(in_EAX,auVar37);
  if (uVar17 == 0) {
    return;
  }
  pAVar5 = This->ptr;
  uVar24 = (ulong)(uVar17 & 0xff);
  auVar130 = *(undefined1 (*) [16])ray;
  auVar131 = *(undefined1 (*) [16])(ray + 0x10);
  auVar132 = *(undefined1 (*) [16])(ray + 0x20);
  fVar35 = *(float *)(ray + 0x40);
  fVar62 = *(float *)(ray + 0x44);
  fVar80 = *(float *)(ray + 0x48);
  fVar119 = *(float *)(ray + 0x4c);
  fVar118 = (float)DAT_01f4bd50;
  fVar126 = DAT_01f4bd50._4_4_;
  fVar128 = DAT_01f4bd50._8_4_;
  fVar129 = DAT_01f4bd50._12_4_;
  auVar64._0_4_ = (uint)fVar35 & -(uint)(fVar118 <= ABS(fVar35));
  auVar64._4_4_ = (uint)fVar62 & -(uint)(fVar126 <= ABS(fVar62));
  auVar64._8_4_ = (uint)fVar80 & -(uint)(fVar128 <= ABS(fVar80));
  auVar64._12_4_ = (uint)fVar119 & -(uint)(fVar129 <= ABS(fVar119));
  auVar99._0_4_ = ~-(uint)(fVar118 <= ABS(fVar35)) & (uint)fVar118;
  auVar99._4_4_ = ~-(uint)(fVar126 <= ABS(fVar62)) & (uint)fVar126;
  auVar99._8_4_ = ~-(uint)(fVar128 <= ABS(fVar80)) & (uint)fVar128;
  auVar99._12_4_ = ~-(uint)(fVar129 <= ABS(fVar119)) & (uint)fVar129;
  auVar99 = auVar99 | auVar64;
  fVar127 = *(float *)(ray + 0x50);
  fVar9 = *(float *)(ray + 0x54);
  fVar10 = *(float *)(ray + 0x58);
  fVar11 = *(float *)(ray + 0x5c);
  auVar84._0_4_ = (uint)fVar127 & -(uint)(fVar118 <= ABS(fVar127));
  auVar84._4_4_ = (uint)fVar9 & -(uint)(fVar126 <= ABS(fVar9));
  auVar84._8_4_ = (uint)fVar10 & -(uint)(fVar128 <= ABS(fVar10));
  auVar84._12_4_ = (uint)fVar11 & -(uint)(fVar129 <= ABS(fVar11));
  auVar110._0_4_ = ~-(uint)(fVar118 <= ABS(fVar127)) & (uint)fVar118;
  auVar110._4_4_ = ~-(uint)(fVar126 <= ABS(fVar9)) & (uint)fVar126;
  auVar110._8_4_ = ~-(uint)(fVar128 <= ABS(fVar10)) & (uint)fVar128;
  auVar110._12_4_ = ~-(uint)(fVar129 <= ABS(fVar11)) & (uint)fVar129;
  auVar110 = auVar110 | auVar84;
  fVar12 = *(float *)(ray + 0x60);
  fVar13 = *(float *)(ray + 100);
  fVar14 = *(float *)(ray + 0x68);
  fVar15 = *(float *)(ray + 0x6c);
  auVar91._0_4_ = ~-(uint)(fVar118 <= ABS(fVar12)) & (uint)fVar118;
  auVar91._4_4_ = ~-(uint)(fVar126 <= ABS(fVar13)) & (uint)fVar126;
  auVar91._8_4_ = ~-(uint)(fVar128 <= ABS(fVar14)) & (uint)fVar128;
  auVar91._12_4_ = ~-(uint)(fVar129 <= ABS(fVar15)) & (uint)fVar129;
  auVar121._4_4_ = (uint)fVar13 & -(uint)(fVar126 <= ABS(fVar13));
  auVar121._0_4_ = (uint)fVar12 & -(uint)(fVar118 <= ABS(fVar12));
  auVar121._8_4_ = (uint)fVar14 & -(uint)(fVar128 <= ABS(fVar14));
  auVar121._12_4_ = (uint)fVar15 & -(uint)(fVar129 <= ABS(fVar15));
  auVar91 = auVar91 | auVar121;
  auVar121 = rcpps(_DAT_01f4bd50,auVar99);
  fVar133 = auVar121._0_4_;
  auVar102._0_4_ = auVar99._0_4_ * fVar133;
  fVar134 = auVar121._4_4_;
  auVar102._4_4_ = auVar99._4_4_ * fVar134;
  fVar135 = auVar121._8_4_;
  auVar102._8_4_ = auVar99._8_4_ * fVar135;
  fVar136 = auVar121._12_4_;
  auVar102._12_4_ = auVar99._12_4_ * fVar136;
  fVar133 = (1.0 - auVar102._0_4_) * fVar133 + fVar133;
  fVar134 = (1.0 - auVar102._4_4_) * fVar134 + fVar134;
  fVar135 = (1.0 - auVar102._8_4_) * fVar135 + fVar135;
  fVar136 = (1.0 - auVar102._12_4_) * fVar136 + fVar136;
  auVar121 = rcpps(auVar102,auVar110);
  fVar137 = auVar121._0_4_;
  fVar138 = auVar121._4_4_;
  fVar139 = auVar121._8_4_;
  fVar140 = auVar121._12_4_;
  fVar137 = (1.0 - auVar110._0_4_ * fVar137) * fVar137 + fVar137;
  fVar138 = (1.0 - auVar110._4_4_ * fVar138) * fVar138 + fVar138;
  fVar139 = (1.0 - auVar110._8_4_ * fVar139) * fVar139 + fVar139;
  fVar140 = (1.0 - auVar110._12_4_ * fVar140) * fVar140 + fVar140;
  auVar121 = rcpps(auVar121,auVar91);
  fVar118 = auVar121._0_4_;
  fVar126 = auVar121._4_4_;
  fVar128 = auVar121._8_4_;
  fVar129 = auVar121._12_4_;
  fVar118 = (1.0 - auVar91._0_4_ * fVar118) * fVar118 + fVar118;
  fVar126 = (1.0 - auVar91._4_4_ * fVar126) * fVar126 + fVar126;
  fVar128 = (1.0 - auVar91._8_4_ * fVar128) * fVar128 + fVar128;
  fVar129 = (1.0 - auVar91._12_4_ * fVar129) * fVar129 + fVar129;
  auVar94._0_12_ = ZEXT812(0);
  auVar94._12_4_ = 0;
  local_1098 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar94);
  auVar50._0_8_ = CONCAT44(-(uint)(fVar62 < 0.0),-(uint)(fVar35 < 0.0)) & 0x100000001;
  auVar50._8_4_ = -(uint)(fVar80 < 0.0) & 1;
  auVar50._12_4_ = -(uint)(fVar119 < 0.0) & 1;
  local_10a8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar94);
  auVar74._0_8_ = CONCAT44(-(uint)(fVar9 < 0.0),-(uint)(fVar127 < 0.0)) & 0x200000002;
  auVar74._8_4_ = -(uint)(fVar10 < 0.0) & 2;
  auVar74._12_4_ = -(uint)(fVar11 < 0.0) & 2;
  auVar86._0_8_ = CONCAT44(-(uint)(fVar13 < 0.0),-(uint)(fVar12 < 0.0)) & 0x400000004;
  auVar86._8_4_ = -(uint)(fVar14 < 0.0) & 4;
  auVar86._12_4_ = -(uint)(fVar15 < 0.0) & 4;
  local_10b8 = auVar37 ^ auVar82 | auVar50 | auVar86 | auVar74;
  local_1038 = auVar130;
  local_1048 = auVar131;
  local_1058 = auVar132;
  local_1068 = fVar118;
  fStack_1064 = fVar126;
  fStack_1060 = fVar128;
  fStack_105c = fVar129;
  local_1078 = fVar133;
  fStack_1074 = fVar134;
  fStack_1070 = fVar135;
  fStack_106c = fVar136;
  local_1088 = fVar137;
  fStack_1084 = fVar138;
  fStack_1080 = fVar139;
  fStack_107c = fVar140;
  local_1198.context = (RTCRayQueryContext *)pAVar5;
  auVar37 = _DAT_01f45a30;
LAB_006677ce:
  lVar6 = 0;
  if (uVar24 != 0) {
    for (; (uVar24 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  iVar19 = *(int *)(local_10b8 + lVar6 * 4);
  auVar38._0_4_ = -(uint)(iVar19 == local_10b8._0_4_);
  auVar38._4_4_ = -(uint)(iVar19 == local_10b8._4_4_);
  auVar38._8_4_ = -(uint)(iVar19 == local_10b8._8_4_);
  auVar38._12_4_ = -(uint)(iVar19 == local_10b8._12_4_);
  uVar18 = movmskps((int)lVar6,auVar38);
  auVar74 = ~auVar38 & auVar37;
  auVar121 = local_1098 & auVar38 | auVar74;
  auVar64 = ~auVar38 & _DAT_01f45a40;
  _local_11c8 = local_10a8 & auVar38 | auVar64;
  auVar82 = auVar130 & auVar38 | auVar74;
  auVar92._4_4_ = auVar82._0_4_;
  auVar92._0_4_ = auVar82._4_4_;
  auVar92._8_4_ = auVar82._12_4_;
  auVar92._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar92,auVar82);
  auVar100._0_8_ = auVar82._8_8_;
  auVar100._8_4_ = auVar82._0_4_;
  auVar100._12_4_ = auVar82._4_4_;
  auVar99 = minps(auVar100,auVar82);
  auVar82 = auVar131 & auVar38 | auVar74;
  auVar111._4_4_ = auVar82._0_4_;
  auVar111._0_4_ = auVar82._4_4_;
  auVar111._8_4_ = auVar82._12_4_;
  auVar111._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar111,auVar82);
  auVar93._0_8_ = auVar82._8_8_;
  auVar93._8_4_ = auVar82._0_4_;
  auVar93._12_4_ = auVar82._4_4_;
  auVar94 = minps(auVar93,auVar82);
  auVar82 = auVar132 & auVar38 | auVar74;
  auVar112._4_4_ = auVar82._0_4_;
  auVar112._0_4_ = auVar82._4_4_;
  auVar112._8_4_ = auVar82._12_4_;
  auVar112._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar112,auVar82);
  auVar101._0_8_ = auVar82._8_8_;
  auVar101._8_4_ = auVar82._0_4_;
  auVar101._12_4_ = auVar82._4_4_;
  auVar102 = minps(auVar101,auVar82);
  auVar82 = auVar130 & auVar38 | auVar64;
  auVar103._4_4_ = auVar82._0_4_;
  auVar103._0_4_ = auVar82._4_4_;
  auVar103._8_4_ = auVar82._12_4_;
  auVar103._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar103,auVar82);
  auVar49._0_8_ = auVar82._8_8_;
  auVar49._8_4_ = auVar82._0_4_;
  auVar49._12_4_ = auVar82._4_4_;
  auVar50 = maxps(auVar49,auVar82);
  auVar82 = auVar131 & auVar38 | auVar64;
  auVar104._4_4_ = auVar82._0_4_;
  auVar104._0_4_ = auVar82._4_4_;
  auVar104._8_4_ = auVar82._12_4_;
  auVar104._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar104,auVar82);
  auVar83._0_8_ = auVar82._8_8_;
  auVar83._8_4_ = auVar82._0_4_;
  auVar83._12_4_ = auVar82._4_4_;
  auVar84 = maxps(auVar83,auVar82);
  auVar82 = auVar132 & auVar38 | auVar64;
  auVar51._4_4_ = auVar82._0_4_;
  auVar51._0_4_ = auVar82._4_4_;
  auVar51._8_4_ = auVar82._12_4_;
  auVar51._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar51,auVar82);
  auVar85._0_8_ = auVar82._8_8_;
  auVar85._8_4_ = auVar82._0_4_;
  auVar85._12_4_ = auVar82._4_4_;
  auVar86 = maxps(auVar85,auVar82);
  auVar87._0_8_ = CONCAT44((uint)fVar134 & auVar38._4_4_,(uint)fVar133 & auVar38._0_4_);
  auVar87._8_4_ = (uint)fVar135 & auVar38._8_4_;
  auVar87._12_4_ = (uint)fVar136 & auVar38._12_4_;
  auVar95._8_4_ = auVar87._8_4_;
  auVar95._0_8_ = auVar87._0_8_;
  auVar95._12_4_ = auVar87._12_4_;
  auVar95 = auVar95 | auVar74;
  auVar122._4_4_ = auVar95._0_4_;
  auVar122._0_4_ = auVar95._4_4_;
  auVar122._8_4_ = auVar95._12_4_;
  auVar122._12_4_ = auVar95._8_4_;
  auVar110 = minps(auVar122,auVar95);
  auVar96._0_8_ = CONCAT44((uint)fVar138 & auVar38._4_4_,(uint)fVar137 & auVar38._0_4_);
  auVar96._8_4_ = (uint)fVar139 & auVar38._8_4_;
  auVar96._12_4_ = (uint)fVar140 & auVar38._12_4_;
  auVar105._8_4_ = auVar96._8_4_;
  auVar105._0_8_ = auVar96._0_8_;
  auVar105._12_4_ = auVar96._12_4_;
  auVar105 = auVar105 | auVar74;
  auVar113._4_4_ = auVar105._0_4_;
  auVar113._0_4_ = auVar105._4_4_;
  auVar113._8_4_ = auVar105._12_4_;
  auVar113._12_4_ = auVar105._8_4_;
  auVar91 = minps(auVar113,auVar105);
  auVar39._0_4_ = auVar38._0_4_ & (uint)fVar118;
  auVar39._4_4_ = auVar38._4_4_ & (uint)fVar126;
  auVar39._8_4_ = auVar38._8_4_ & (uint)fVar128;
  auVar39._12_4_ = auVar38._12_4_ & (uint)fVar129;
  auVar74 = auVar74 | auVar39;
  auVar106._4_4_ = auVar74._0_4_;
  auVar106._0_4_ = auVar74._4_4_;
  auVar106._8_4_ = auVar74._12_4_;
  auVar106._12_4_ = auVar74._8_4_;
  auVar82 = minps(auVar106,auVar74);
  auVar75._0_8_ = auVar82._8_8_;
  auVar75._8_4_ = auVar82._0_4_;
  auVar75._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar75,auVar82);
  auVar108._0_8_ = auVar110._0_8_;
  auVar108._8_4_ = auVar110._4_4_;
  auVar108._12_4_ = auVar91._4_4_;
  auVar107._8_8_ = auVar108._8_8_;
  auVar107._0_4_ = auVar110._0_4_;
  auVar107._4_4_ = auVar91._0_4_;
  auVar123._4_4_ = auVar91._8_4_;
  auVar123._0_4_ = auVar110._8_4_;
  auVar123._8_4_ = auVar110._12_4_;
  auVar123._12_4_ = auVar91._12_4_;
  auVar74 = minps(auVar123,auVar107);
  fVar80 = auVar82._0_4_;
  fVar119 = auVar74._0_4_;
  fVar127 = auVar74._4_4_;
  auVar87 = auVar87 | auVar64;
  auVar76._4_4_ = auVar87._0_4_;
  auVar76._0_4_ = auVar87._4_4_;
  auVar76._8_4_ = auVar87._12_4_;
  auVar76._12_4_ = auVar87._8_4_;
  auVar74 = maxps(auVar76,auVar87);
  auVar96 = auVar96 | auVar64;
  auVar88._4_4_ = auVar96._0_4_;
  auVar88._0_4_ = auVar96._4_4_;
  auVar88._8_4_ = auVar96._12_4_;
  auVar88._12_4_ = auVar96._8_4_;
  auVar91 = maxps(auVar88,auVar96);
  auVar39 = auVar39 | auVar64;
  auVar65._4_4_ = auVar39._0_4_;
  auVar65._0_4_ = auVar39._4_4_;
  auVar65._8_4_ = auVar39._12_4_;
  auVar65._12_4_ = auVar39._8_4_;
  auVar82 = maxps(auVar65,auVar39);
  auVar40._0_8_ = auVar82._8_8_;
  auVar40._8_4_ = auVar82._0_4_;
  auVar40._12_4_ = auVar82._4_4_;
  auVar82 = maxps(auVar40,auVar82);
  auVar67._0_8_ = auVar74._0_8_;
  auVar67._8_4_ = auVar74._4_4_;
  auVar67._12_4_ = auVar91._4_4_;
  auVar66._8_8_ = auVar67._8_8_;
  auVar66._0_4_ = auVar74._0_4_;
  auVar66._4_4_ = auVar91._0_4_;
  auVar77._4_4_ = auVar91._8_4_;
  auVar77._0_4_ = auVar74._8_4_;
  auVar77._8_4_ = auVar74._12_4_;
  auVar77._12_4_ = auVar91._12_4_;
  auVar74 = maxps(auVar77,auVar66);
  auVar114._4_4_ = auVar121._0_4_;
  auVar114._0_4_ = auVar121._4_4_;
  auVar114._8_4_ = auVar121._12_4_;
  auVar114._12_4_ = auVar121._8_4_;
  auVar91 = minps(auVar114,auVar121);
  auVar52._4_4_ = local_11c8._0_4_;
  auVar52._0_4_ = local_11c8._4_4_;
  auVar52._8_4_ = local_11c8._12_4_;
  auVar52._12_4_ = local_11c8._8_4_;
  auVar64 = maxps(auVar52,_local_11c8);
  fVar62 = auVar64._8_4_;
  uVar17 = -(uint)(fVar119 < 0.0);
  uVar33 = -(uint)(fVar127 < 0.0);
  uVar34 = -(uint)(fVar80 < 0.0);
  auVar36._0_4_ = ~uVar17 & (uint)fVar119;
  auVar36._4_4_ = ~uVar33 & (uint)fVar127;
  auVar36._8_4_ = ~uVar34 & (uint)fVar80;
  auVar63._0_4_ = auVar74._0_4_ & uVar17;
  auVar63._4_4_ = auVar74._4_4_ & uVar33;
  auVar63._8_4_ = auVar82._0_4_ & uVar34;
  auVar63 = auVar63 | auVar36;
  auVar98._0_4_ = ~uVar17 & auVar99._0_4_;
  auVar98._4_4_ = ~uVar33 & auVar94._0_4_;
  auVar98._8_4_ = ~uVar34 & auVar102._0_4_;
  auVar81._0_4_ = auVar50._0_4_ & uVar17;
  auVar81._4_4_ = auVar84._0_4_ & uVar33;
  auVar81._8_4_ = auVar86._0_4_ & uVar34;
  auVar81 = auVar81 | auVar98;
  local_f98 = auVar63._0_4_;
  local_f88 = auVar63._4_4_;
  local_fc8 = auVar63._8_4_;
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
  uVar31 = (ulong)(local_f88 < 0.0) << 4 | 0x20;
  uVar32 = (ulong)(local_fc8 < 0.0) << 4 | 0x40;
  local_1148._0_4_ = auVar64._0_4_;
  fVar35 = fVar62;
  if (fVar62 <= (float)local_1148._0_4_) {
    fVar35 = (float)local_1148._0_4_;
  }
  auVar120._0_4_ = (uint)fVar119 & uVar17;
  auVar120._4_4_ = (uint)fVar127 & uVar33;
  auVar120._8_4_ = (uint)fVar80 & uVar34;
  auVar90._0_4_ = ~uVar17 & auVar74._0_4_;
  auVar90._4_4_ = ~uVar33 & auVar74._4_4_;
  auVar90._8_4_ = ~uVar34 & auVar82._0_4_;
  auVar90 = auVar90 | auVar120;
  local_fa8 = (float)(auVar99._0_4_ & uVar17 | ~uVar17 & auVar50._0_4_) * local_f98;
  local_fb8 = (float)(auVar94._0_4_ & uVar33 | ~uVar33 & auVar84._0_4_) * local_f88;
  fVar80 = (float)(auVar102._0_4_ & uVar34 | ~uVar34 & auVar86._0_4_) * local_fc8;
  local_fd8 = auVar90._0_4_;
  local_fe8 = auVar81._0_4_ * local_fd8;
  local_ff8 = auVar90._4_4_;
  local_1008 = auVar81._4_4_ * local_ff8;
  local_1018 = auVar90._8_4_;
  fStack_1130 = auVar81._8_4_ * local_1018;
  uVar30 = (ulong)(local_f98 < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar5[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  uVar48 = auVar91._0_4_;
  auVar115._8_4_ = auVar91._8_4_;
  auVar53._4_4_ = uVar48;
  auVar53._0_4_ = uVar48;
  auVar53._8_4_ = uVar48;
  auVar53._12_4_ = uVar48;
  auVar115._4_4_ = auVar115._8_4_;
  auVar115._0_4_ = auVar115._8_4_;
  auVar115._12_4_ = auVar115._8_4_;
  local_1148 = minps(auVar115,auVar53);
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  auVar61._4_4_ = 0;
  auVar61._0_4_ = fVar35;
  auVar61._8_4_ = fVar62;
  auVar61._12_4_ = auVar64._12_4_;
  local_1138._4_4_ = fStack_1130;
  local_1138._0_4_ = fStack_1130;
  fStack_112c = fStack_1130;
  pSVar26 = stack + 1;
  do {
    uVar48 = auVar61._0_4_;
LAB_00667ba1:
    do {
      do {
        do {
          if (pSVar26 == stack) {
            uVar24 = uVar24 & ~CONCAT44((int)((ulong)lVar6 >> 0x20),uVar18);
            if (uVar24 == 0) {
              return;
            }
            goto LAB_006677ce;
          }
          fVar35 = (float)pSVar26[-1].dist;
          pSVar26 = pSVar26 + -1;
          auVar41._4_4_ = fVar35;
          auVar41._0_4_ = fVar35;
          auVar41._8_4_ = fVar35;
          auVar41._12_4_ = fVar35;
          auVar54._4_4_ = -(uint)(fVar35 < (float)local_11c8._4_4_);
          auVar54._0_4_ = -(uint)(fVar35 < (float)local_11c8._0_4_);
          auVar54._8_4_ = -(uint)(fVar35 < fStack_11c0);
          auVar54._12_4_ = -(uint)(fVar35 < fStack_11bc);
          iVar19 = movmskps((int)stack,auVar54);
        } while (iVar19 == 0);
        uVar20 = (pSVar26->ptr).ptr;
        while ((uVar20 & 8) == 0) {
          pfVar3 = (float *)(uVar20 + 0x20 + uVar30);
          auVar42._0_4_ = *pfVar3 * local_f98 - local_fa8;
          auVar42._4_4_ = pfVar3[1] * fStack_f94 - fStack_fa4;
          auVar42._8_4_ = pfVar3[2] * fStack_f90 - fStack_fa0;
          auVar42._12_4_ = pfVar3[3] * fStack_f8c - fStack_f9c;
          pfVar3 = (float *)(uVar20 + 0x20 + uVar31);
          auVar55._0_4_ = *pfVar3 * local_f88 - local_fb8;
          auVar55._4_4_ = pfVar3[1] * fStack_f84 - fStack_fb4;
          auVar55._8_4_ = pfVar3[2] * fStack_f80 - fStack_fb0;
          auVar55._12_4_ = pfVar3[3] * fStack_f7c - fStack_fac;
          auVar82 = maxps(auVar42,auVar55);
          pfVar3 = (float *)(uVar20 + 0x20 + uVar32);
          auVar56._0_4_ = *pfVar3 * local_fc8 - fVar80;
          auVar56._4_4_ = pfVar3[1] * fStack_fc4 - fVar80;
          auVar56._8_4_ = pfVar3[2] * fStack_fc0 - fVar80;
          auVar56._12_4_ = pfVar3[3] * fStack_fbc - fVar80;
          auVar50 = maxps(auVar56,local_1148);
          fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar82,auVar50);
          pfVar3 = (float *)(uVar20 + 0x20 + (uVar30 ^ 0x10));
          auVar57._0_4_ = *pfVar3 * local_fd8 - local_fe8;
          auVar57._4_4_ = pfVar3[1] * fStack_fd4 - fStack_fe4;
          auVar57._8_4_ = pfVar3[2] * fStack_fd0 - fStack_fe0;
          auVar57._12_4_ = pfVar3[3] * fStack_fcc - fStack_fdc;
          pfVar3 = (float *)(uVar20 + 0x20 + (uVar31 ^ 0x10));
          auVar68._0_4_ = *pfVar3 * local_ff8 - local_1008;
          auVar68._4_4_ = pfVar3[1] * fStack_ff4 - fStack_1004;
          auVar68._8_4_ = pfVar3[2] * fStack_ff0 - fStack_1000;
          auVar68._12_4_ = pfVar3[3] * fStack_fec - fStack_ffc;
          auVar82 = minps(auVar57,auVar68);
          pfVar3 = (float *)(uVar20 + 0x20 + (uVar32 ^ 0x10));
          auVar69._0_4_ = *pfVar3 * local_1018 - (float)local_1138._0_4_;
          auVar69._4_4_ = pfVar3[1] * fStack_1014 - (float)local_1138._4_4_;
          auVar69._8_4_ = pfVar3[2] * fStack_1010 - fStack_1130;
          auVar69._12_4_ = pfVar3[3] * fStack_100c - fStack_112c;
          auVar16._4_4_ = uVar48;
          auVar16._0_4_ = uVar48;
          auVar16._8_4_ = uVar48;
          auVar16._12_4_ = uVar48;
          auVar50 = minps(auVar69,auVar16);
          auVar82 = minps(auVar82,auVar50);
          auVar43._4_4_ = -(uint)(fmin.field_0._4_4_ <= auVar82._4_4_);
          auVar43._0_4_ = -(uint)(fmin.field_0._0_4_ <= auVar82._0_4_);
          auVar43._8_4_ = -(uint)(fmin.field_0._8_4_ <= auVar82._8_4_);
          auVar43._12_4_ = -(uint)(fmin.field_0._12_4_ <= auVar82._12_4_);
          uVar17 = movmskps((int)uVar31,auVar43);
          if (uVar17 == 0) goto LAB_00667ba1;
          uVar29 = (ulong)(uVar17 & 0xff);
          uVar27 = 0;
          uVar21 = 8;
          auVar41 = auVar37;
          do {
            lVar7 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            fVar35 = *(float *)(uVar20 + 0x20 + lVar7 * 4);
            fVar62 = *(float *)(uVar20 + 0x30 + lVar7 * 4);
            fVar119 = *(float *)(uVar20 + 0x40 + lVar7 * 4);
            fVar127 = *(float *)(uVar20 + 0x50 + lVar7 * 4);
            auVar58._0_8_ =
                 CONCAT44((fVar35 - auVar130._4_4_) * fVar134,(fVar35 - auVar130._0_4_) * fVar133);
            auVar58._8_4_ = (fVar35 - auVar130._8_4_) * fVar135;
            auVar58._12_4_ = (fVar35 - auVar130._12_4_) * fVar136;
            auVar70._0_8_ =
                 CONCAT44((fVar119 - auVar131._4_4_) * fVar138,(fVar119 - auVar131._0_4_) * fVar137)
            ;
            auVar70._8_4_ = (fVar119 - auVar131._8_4_) * fVar139;
            auVar70._12_4_ = (fVar119 - auVar131._12_4_) * fVar140;
            fVar35 = *(float *)(uVar20 + 0x60 + lVar7 * 4);
            auVar97._0_8_ =
                 CONCAT44((fVar35 - auVar132._4_4_) * fVar126,(fVar35 - auVar132._0_4_) * fVar118);
            auVar97._8_4_ = (fVar35 - auVar132._8_4_) * fVar128;
            auVar97._12_4_ = (fVar35 - auVar132._12_4_) * fVar129;
            auVar78._0_4_ = (fVar62 - auVar130._0_4_) * fVar133;
            auVar78._4_4_ = (fVar62 - auVar130._4_4_) * fVar134;
            auVar78._8_4_ = (fVar62 - auVar130._8_4_) * fVar135;
            auVar78._12_4_ = (fVar62 - auVar130._12_4_) * fVar136;
            auVar89._0_4_ = (fVar127 - auVar131._0_4_) * fVar137;
            auVar89._4_4_ = (fVar127 - auVar131._4_4_) * fVar138;
            auVar89._8_4_ = (fVar127 - auVar131._8_4_) * fVar139;
            auVar89._12_4_ = (fVar127 - auVar131._12_4_) * fVar140;
            fVar35 = *(float *)(uVar20 + 0x70 + lVar7 * 4);
            auVar109._0_4_ = (fVar35 - auVar132._0_4_) * fVar118;
            auVar109._4_4_ = (fVar35 - auVar132._4_4_) * fVar126;
            auVar109._8_4_ = (fVar35 - auVar132._8_4_) * fVar128;
            auVar109._12_4_ = (fVar35 - auVar132._12_4_) * fVar129;
            auVar116._8_4_ = auVar58._8_4_;
            auVar116._0_8_ = auVar58._0_8_;
            auVar116._12_4_ = auVar58._12_4_;
            auVar82 = minps(auVar116,auVar78);
            auVar124._8_4_ = auVar70._8_4_;
            auVar124._0_8_ = auVar70._0_8_;
            auVar124._12_4_ = auVar70._12_4_;
            auVar50 = minps(auVar124,auVar89);
            auVar82 = maxps(auVar82,auVar50);
            auVar125._8_4_ = auVar97._8_4_;
            auVar125._0_8_ = auVar97._0_8_;
            auVar125._12_4_ = auVar97._12_4_;
            auVar50 = minps(auVar125,auVar109);
            auVar64 = maxps(auVar82,auVar50);
            auVar82 = maxps(auVar58,auVar78);
            auVar50 = maxps(auVar70,auVar89);
            auVar82 = minps(auVar82,auVar50);
            auVar50 = maxps(auVar97,auVar109);
            auVar82 = minps(auVar82,auVar50);
            auVar50 = maxps(auVar64,auVar121);
            auVar82 = minps(auVar82,_local_11c8);
            auVar117._4_4_ = -(uint)(auVar50._4_4_ <= auVar82._4_4_);
            auVar117._0_4_ = -(uint)(auVar50._0_4_ <= auVar82._0_4_);
            auVar117._8_4_ = -(uint)(auVar50._8_4_ <= auVar82._8_4_);
            auVar117._12_4_ = -(uint)(auVar50._12_4_ <= auVar82._12_4_);
            uVar17 = movmskps((int)valid_i,auVar117);
            valid_i = (vint<4> *)(ulong)uVar17;
            uVar22 = uVar21;
            if (uVar17 != 0) {
              fVar35 = fmin.field_0.v[lVar7];
              auVar82 = ZEXT416((uint)fVar35);
              uVar22 = *(ulong *)(uVar20 + lVar7 * 8);
              auVar79._4_4_ = -(uint)(fVar35 < auVar41._4_4_);
              auVar79._0_4_ = -(uint)(fVar35 < auVar41._0_4_);
              auVar79._8_4_ = -(uint)(fVar35 < auVar41._8_4_);
              auVar79._12_4_ = -(uint)(fVar35 < auVar41._12_4_);
              uVar17 = movmskps(uVar17,auVar79);
              valid_i = (vint<4> *)(ulong)uVar17;
              if (uVar17 == 0) {
                (pSVar26->ptr).ptr = uVar22;
                uVar22 = uVar21;
                auVar44 = auVar41;
              }
              else {
                if (uVar21 == 8) {
                  auVar41._8_4_ = fVar35;
                  auVar41._0_8_ = CONCAT44(fVar35,fVar35);
                  auVar41._12_4_ = fVar35;
                  goto LAB_00667dac;
                }
                (pSVar26->ptr).ptr = uVar21;
                auVar44._8_4_ = fVar35;
                auVar44._0_8_ = CONCAT44(fVar35,fVar35);
                auVar44._12_4_ = fVar35;
                auVar82 = auVar41;
              }
              auVar41 = auVar44;
              uVar27 = uVar27 + 1;
              pSVar26->dist = auVar82._0_4_;
              pSVar26 = pSVar26 + 1;
            }
LAB_00667dac:
            local_1198.context = (RTCRayQueryContext *)(uVar29 - 1);
            uVar29 = uVar29 & (ulong)local_1198.context;
            uVar21 = uVar22;
          } while (uVar29 != 0);
          if (uVar22 == 8) goto LAB_00667ba1;
          uVar20 = uVar22;
          if (1 < uVar27) {
            pSVar1 = pSVar26 + -2;
            local_1198.geometryUserPtr._0_4_ = pSVar26[-2].dist;
            local_1198.context = (RTCRayQueryContext *)(pSVar26 + -1);
            if ((uint)local_1198.geometryUserPtr < pSVar26[-1].dist) {
              SVar4 = *pSVar1;
              pSVar26[-2].dist = pSVar26[-1].dist;
              (pSVar1->ptr).ptr =
                   (size_t)(((AccelData *)local_1198.context)->super_RefCount)._vptr_RefCount;
              local_1198.valid = (int *)SVar4.ptr.ptr;
              (((AccelData *)local_1198.context)->super_RefCount)._vptr_RefCount =
                   (_func_int **)local_1198.valid;
              local_1198.geometryUserPtr._0_4_ = SVar4.dist;
              pSVar26[-1].dist = (uint)local_1198.geometryUserPtr;
            }
            valid_i = (vint<4> *)(ulong)(uint)local_1198.geometryUserPtr;
            if (uVar27 != 2) {
              pSVar2 = pSVar26 + -3;
              uVar17 = pSVar26[-3].dist;
              if (uVar17 < pSVar26[-1].dist) {
                SVar4 = *pSVar2;
                pSVar26[-3].dist = pSVar26[-1].dist;
                (pSVar2->ptr).ptr =
                     (size_t)(((AccelData *)local_1198.context)->super_RefCount)._vptr_RefCount;
                local_1198.valid = (int *)SVar4.ptr.ptr;
                (((AccelData *)local_1198.context)->super_RefCount)._vptr_RefCount =
                     (_func_int **)local_1198.valid;
                local_1198.geometryUserPtr._0_4_ = SVar4.dist;
                pSVar26[-1].dist = (uint)local_1198.geometryUserPtr;
                uVar17 = pSVar26[-3].dist;
              }
              valid_i = (vint<4> *)(ulong)uVar17;
              if (uVar17 < pSVar26[-2].dist) {
                SVar4 = *pSVar2;
                pSVar26[-3].dist = pSVar26[-2].dist;
                (pSVar2->ptr).ptr = (pSVar1->ptr).ptr;
                local_1198.valid = (int *)SVar4.ptr.ptr;
                (pSVar1->ptr).ptr = (size_t)local_1198.valid;
                local_1198.geometryUserPtr._0_4_ = SVar4.dist;
                local_1198.context = (RTCRayQueryContext *)(ulong)(uint)local_1198.geometryUserPtr;
                pSVar26[-2].dist = (uint)local_1198.geometryUserPtr;
              }
            }
          }
        }
        auVar71._4_4_ = -(uint)(auVar41._4_4_ < (float)local_11c8._4_4_);
        auVar71._0_4_ = -(uint)(auVar41._0_4_ < (float)local_11c8._0_4_);
        auVar71._8_4_ = -(uint)(auVar41._8_4_ < fStack_11c0);
        auVar71._12_4_ = -(uint)(auVar41._12_4_ < fStack_11bc);
        iVar19 = movmskps((uint)uVar20,auVar71);
      } while (iVar19 == 0);
      pGVar23 = (Geometry *)((ulong)((uint)uVar20 & 0xf) - 8);
      local_1028 = auVar71;
      local_1168 = pGVar23;
      for (pGVar28 = (Geometry *)0x0; pGVar23 != pGVar28;
          pGVar28 = (Geometry *)((long)&(pGVar28->super_RefCount)._vptr_RefCount + 1)) {
        local_1198.geomID = *(uint *)((uVar20 & 0xfffffffffffffff0) + (long)pGVar28 * 8);
        valid_i = (vint<4> *)(ulong)local_1198.geomID;
        local_1168 = (context->scene->geometries).items[(long)valid_i].ptr;
        uVar17 = local_1168->mask;
        auVar45._0_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x90)) == 0);
        auVar45._4_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x94)) == 0);
        auVar45._8_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x98)) == 0);
        auVar45._12_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x9c)) == 0);
        fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(~auVar45 & auVar71);
        uVar17 = movmskps((int)local_1198.context,(undefined1  [16])fmin.field_0);
        local_1198.context = (RTCRayQueryContext *)(ulong)uVar17;
        if (uVar17 != 0) {
          local_1198.primID = *(uint *)((uVar20 & 0xfffffffffffffff0) + 4 + (long)pGVar28 * 8);
          local_1198.geometryUserPtr = local_1168->userPtr;
          local_1198.valid = (int *)&fmin;
          local_1198.context = context->user;
          local_1198.N = 4;
          local_1160 = 0;
          local_1158 = context->args;
          pp_Var25 = (_func_int **)local_1158->intersect;
          if (pp_Var25 == (_func_int **)0x0) {
            pp_Var25 = local_1168[1].super_RefCount._vptr_RefCount;
          }
          valid_i = (vint<4> *)&local_1198;
          local_1198.rayhit = (RTCRayHitN *)ray;
          local_1168 = (Geometry *)(*(code *)pp_Var25)((RTCIntersectFunctionNArguments *)valid_i);
          auVar71 = local_1028;
          fVar118 = local_1068;
          fVar126 = fStack_1064;
          fVar128 = fStack_1060;
          fVar129 = fStack_105c;
          auVar130 = local_1038;
          auVar131 = local_1048;
          auVar132 = local_1058;
          auVar37 = _DAT_01f45a30;
          fVar133 = local_1078;
          fVar134 = fStack_1074;
          fVar135 = fStack_1070;
          fVar136 = fStack_106c;
          fVar137 = local_1088;
          fVar138 = fStack_1084;
          fVar139 = fStack_1080;
          fVar140 = fStack_107c;
        }
      }
      uVar17 = auVar71._0_4_;
      auVar59._0_4_ = -(uint)(*(float *)(ray + 0x80) < (float)local_11c8._0_4_) & uVar17;
      uVar33 = auVar71._4_4_;
      auVar59._4_4_ = -(uint)(*(float *)(ray + 0x84) < (float)local_11c8._4_4_) & uVar33;
      uVar34 = auVar71._8_4_;
      auVar59._8_4_ = -(uint)(*(float *)(ray + 0x88) < fStack_11c0) & uVar34;
      uVar73 = auVar71._12_4_;
      auVar59._12_4_ = -(uint)(*(float *)(ray + 0x8c) < fStack_11bc) & uVar73;
      iVar19 = movmskps((int)local_1168,auVar59);
    } while (iVar19 == 0);
    auVar46._0_4_ = (uint)*(float *)(ray + 0x80) & uVar17;
    auVar46._4_4_ = (uint)*(float *)(ray + 0x84) & uVar33;
    auVar46._8_4_ = (uint)*(float *)(ray + 0x88) & uVar34;
    auVar46._12_4_ = (uint)*(float *)(ray + 0x8c) & uVar73;
    auVar72._0_4_ = ~uVar17 & local_11c8._0_4_;
    auVar72._4_4_ = ~uVar33 & local_11c8._4_4_;
    auVar72._8_4_ = ~uVar34 & (uint)fStack_11c0;
    auVar72._12_4_ = ~uVar73 & (uint)fStack_11bc;
    _local_11c8 = auVar72 | auVar46;
    auVar47._4_4_ = local_11c8._0_4_;
    auVar47._0_4_ = local_11c8._4_4_;
    auVar47._8_4_ = local_11c8._12_4_;
    auVar47._12_4_ = local_11c8._8_4_;
    auVar82 = maxps(auVar47,_local_11c8);
    auVar8._4_8_ = auVar59._8_8_;
    auVar8._0_4_ = auVar82._4_4_;
    auVar60._0_8_ = auVar8._0_8_ << 0x20;
    auVar60._8_4_ = auVar82._8_4_;
    auVar60._12_4_ = auVar82._12_4_;
    auVar61._8_8_ = auVar82._8_8_;
    auVar61._0_8_ = auVar60._8_8_;
    if (auVar82._8_4_ <= auVar82._0_4_) {
      auVar61._0_4_ = auVar82._0_4_;
    }
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }